

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<SignedShort_Signed_Test>::CreateTest
          (ParameterizedTestFactory<SignedShort_Signed_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<short>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_00234f78;
  this_00[1]._vptr_Test = (_func_int **)&PTR__SignedShort_Signed_Test_00234fb8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }